

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

shared_ptr<cxxopts::Value> __thiscall
cxxopts::values::abstract_value<bool>::implicit_value(abstract_value<bool> *this,string *value)

{
  string *in_RDX;
  shared_ptr<cxxopts::Value> sVar1;
  string *value_local;
  abstract_value<bool> *this_local;
  
  value[1].field_2._M_local_buf[1] = '\x01';
  std::__cxx11::string::operator=((string *)(value[2].field_2._M_local_buf + 8),in_RDX);
  sVar1 = std::enable_shared_from_this<cxxopts::Value>::shared_from_this
                    ((enable_shared_from_this<cxxopts::Value> *)this);
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Value;
  return (shared_ptr<cxxopts::Value>)
         sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value>
      implicit_value(const std::string& value) override
      {
        m_implicit = true;
        m_implicit_value = value;
        return shared_from_this();
      }